

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall
chrono::ChVector<double>::DirToDxDyDz
          (ChVector<double> *this,ChVector<double> *Vx,ChVector<double> *Vy,ChVector<double> *Vz,
          ChVector<double> *Vsingular)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChVector<double> local_48;
  
  bVar3 = IsNull(this);
  if (bVar3) {
    Vx->m_data[0] = 1.0;
    Vx->m_data[1] = 0.0;
    Vx->m_data[2] = 0.0;
  }
  else {
    GetNormalized(&local_48,this);
    if (&local_48 != Vx) {
      Vx->m_data[0] = local_48.m_data[0];
      Vx->m_data[1] = local_48.m_data[1];
      Vx->m_data[2] = local_48.m_data[2];
    }
  }
  Cross(Vz,Vx,Vsingular);
  dVar5 = Length(Vz);
  if (dVar5 < 0.0001) {
    local_48.m_data[2] = 0.0;
    local_48.m_data[0] = 0.0;
    local_48.m_data[1] = 0.0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = Vsingular->m_data[0];
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar4 = vandpd_avx512vl(auVar6,auVar4);
    if (0.9 <= auVar4._0_8_) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = Vsingular->m_data[1];
      auVar1._8_8_ = 0x7fffffffffffffff;
      auVar1._0_8_ = 0x7fffffffffffffff;
      auVar4 = vandpd_avx512vl(auVar7,auVar1);
      if (0.9 <= auVar4._0_8_) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = Vsingular->m_data[2];
        auVar2._8_8_ = 0x7fffffffffffffff;
        auVar2._0_8_ = 0x7fffffffffffffff;
        auVar4 = vandpd_avx512vl(auVar8,auVar2);
        if (auVar4._0_8_ < 0.9) {
          local_48.m_data[0] = 0.0;
          local_48.m_data[1] = 0.0;
          local_48.m_data[2] = 1.0;
        }
      }
      else {
        local_48.m_data[1] = 1.0;
      }
    }
    else {
      local_48.m_data[0] = 1.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
    }
    Cross(Vz,Vx,&local_48);
    dVar5 = Length(Vz);
  }
  Scale(Vz,1.0 / dVar5);
  Cross(Vy,Vz,Vx);
  return;
}

Assistant:

inline void ChVector<Real>::DirToDxDyDz(ChVector<Real>& Vx,
                                        ChVector<Real>& Vy,
                                        ChVector<Real>& Vz,
                                        const ChVector<Real>& Vsingular) const {
    // set Vx.
    if (this->IsNull())
        Vx = ChVector<Real>(1, 0, 0);
    else
        Vx = this->GetNormalized();

    Vz.Cross(Vx, Vsingular);
    Real zlen = Vz.Length();

    // if near singularity, change the singularity reference vector.
    if (zlen < 0.0001) {
        ChVector<Real> mVsingular;

        if (std::abs(Vsingular.m_data[0]) < 0.9)
            mVsingular = ChVector<Real>(1, 0, 0);
        else if (std::abs(Vsingular.m_data[1]) < 0.9)
            mVsingular = ChVector<Real>(0, 1, 0);
        else if (std::abs(Vsingular.m_data[2]) < 0.9)
            mVsingular = ChVector<Real>(0, 0, 1);

        Vz.Cross(Vx, mVsingular);
        zlen = Vz.Length();  // now should be nonzero length.
    }

    // normalize Vz.
    Vz.Scale(1 / zlen);

    // compute Vy.
    Vy.Cross(Vz, Vx);
}